

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptOperators.cpp
# Opt level: O2

void dummy_Op_SetNativeIntElementI_Int32(void)

{
  return;
}

Assistant:

BOOL JavascriptOperators::OP_SetNativeFloatElementI(
        Var instance,
        Var aElementIndex,
        ScriptContext* scriptContext,
        PropertyOperationFlags flags,
        double dValue)
    {
        JIT_HELPER_REENTRANT_HEADER(Op_SetNativeFloatElementI);

        INT_PTR vt = (INT_PTR)nullptr;
        vt = VirtualTableInfoBase::GetVirtualTable(instance);

        if (TaggedInt::Is(aElementIndex))
        {
            int32 indexInt = TaggedInt::ToInt32(aElementIndex);
            if (indexInt >= 0 && scriptContext->optimizationOverrides.IsEnabledArraySetElementFastPath())
            {
                JavascriptNativeFloatArray *arr = VarTo<JavascriptNativeFloatArray>(instance);
                if (!(arr->TryGrowHeadSegmentAndSetItem<double, JavascriptNativeFloatArray>((uint32)indexInt, dValue)))
                {
                    arr->SetItem(indexInt, dValue);
                }
                return vt != VirtualTableInfoBase::GetVirtualTable(instance);
            }
        }

        JavascriptOperators::OP_SetElementI(instance, aElementIndex, JavascriptNumber::ToVarWithCheck(dValue, scriptContext), scriptContext, flags);
        return vt != VirtualTableInfoBase::GetVirtualTable(instance);
        JIT_HELPER_END(Op_SetNativeFloatElementI);
    }